

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O1

uint8_t * __thiscall
proto2_unittest::TestHugeFieldNumbersLite::_InternalSerialize
          (TestHugeFieldNumbersLite *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  RepeatedField<int> *pRVar1;
  ForeignMessageLite *value;
  MessageLite *value_00;
  void *data;
  bool bVar2;
  unique_ptr<const_void_*[],_std::default_delete<const_void_*[]>_> uVar3;
  int iVar4;
  uint *puVar5;
  ulong uVar6;
  undefined8 *puVar7;
  int *piVar8;
  ulong uVar9;
  char *pcVar10;
  uint uVar11;
  size_t sVar12;
  uint uVar13;
  long lVar14;
  uint32_t uVar15;
  uint uVar16;
  int *piVar17;
  int index;
  long *plVar18;
  byte *pbVar19;
  byte *pbVar20;
  string_view s;
  string_view s_00;
  string_view s_01;
  MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  
  if (*(short *)((long)&this->field_0 + 10) != 0) {
    target = google::protobuf::internal::ExtensionSet::_InternalSerializeAllImpl
                       (&(this->field_0)._impl_._extensions_,
                        (MessageLite *)_TestHugeFieldNumbersLite_default_instance_,target,stream);
  }
  uVar16 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar16 & 0x10) != 0) {
    _InternalSerialize();
    target = (uint8_t *)local_40.size_;
  }
  if ((uVar16 & 0x20) != 0) {
    _InternalSerialize();
    target = (uint8_t *)local_40.size_;
  }
  pRVar1 = &(this->field_0)._impl_.repeated_int32_;
  iVar4 = google::protobuf::internal::SooRep::size
                    (&pRVar1->soo_rep_,(*(byte *)((long)&this->field_0 + 0x20) & 4) == 0);
  if (0 < iVar4) {
    index = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      puVar5 = (uint *)google::protobuf::RepeatedField<int>::Get(pRVar1,index);
      uVar13 = *puVar5;
      uVar6 = (ulong)(int)uVar13;
      pbVar19 = target + 1;
      uVar11 = 0xffffe390;
      do {
        pbVar20 = pbVar19;
        pbVar20[-1] = (byte)uVar11 | 0x80;
        pbVar19 = pbVar20 + 1;
        bVar2 = 0x3fff < uVar11;
        uVar11 = uVar11 >> 7;
      } while (bVar2);
      *pbVar20 = 0xf;
      uVar9 = uVar6;
      if (0x7f < uVar13) {
        do {
          *pbVar19 = (byte)uVar9 | 0x80;
          uVar6 = uVar9 >> 7;
          pbVar19 = pbVar19 + 1;
          bVar2 = 0x3fff < uVar9;
          uVar9 = uVar6;
        } while (bVar2);
      }
      *pbVar19 = (byte)uVar6;
      target = pbVar19 + 1;
      index = index + 1;
    } while (index != iVar4);
  }
  uVar13 = *(uint *)((long)&this->field_0 + 0x40);
  if ((int)uVar13 < 1) {
LAB_001c808a:
    if ((uVar16 & 0x40) != 0) {
      _InternalSerialize();
      target = (uint8_t *)local_40.size_;
    }
    if ((uVar16 & 1) != 0) {
      puVar7 = (undefined8 *)
               ((ulong)(this->field_0)._impl_.optional_string_.tagged_ptr_.ptr_ & 0xfffffffffffffffc
               );
      s._M_str = (char *)*puVar7;
      s._M_len = puVar7[1];
      target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                         (stream,0x1ffffc75,s,target);
    }
    if ((uVar16 & 2) != 0) {
      puVar7 = (undefined8 *)
               ((ulong)(this->field_0)._impl_.optional_bytes_.tagged_ptr_.ptr_ & 0xfffffffffffffffc)
      ;
      s_00._M_str = (char *)*puVar7;
      s_00._M_len = puVar7[1];
      target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                         (stream,0x1ffffc76,s_00,target);
    }
    if ((uVar16 & 4) != 0) {
      value = (this->field_0)._impl_.optional_message_;
      target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                         (0x1ffffc77,&value->super_MessageLite,*(int *)((long)&value->field_0 + 4),
                          target,stream);
    }
    if ((uVar16 & 8) != 0) {
      if (stream->end_ <= target) goto LAB_001c84d0;
      goto LAB_001c8119;
    }
  }
  else {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    if (target < stream->end_) {
      pRVar1 = &(this->field_0)._impl_.packed_int32_;
      uVar11 = 0xffffe39a;
      do {
        pbVar19 = target;
        *pbVar19 = (byte)uVar11 | 0x80;
        target = pbVar19 + 1;
        bVar2 = 0x3fff < uVar11;
        uVar11 = uVar11 >> 7;
      } while (bVar2);
      *target = 0xf;
      pbVar19 = pbVar19 + 2;
      uVar11 = uVar13;
      if (0x7f < uVar13) {
        do {
          target = pbVar19;
          *target = (byte)uVar11 | 0x80;
          uVar13 = uVar11 >> 7;
          pbVar19 = target + 1;
          bVar2 = 0x3fff < uVar11;
          uVar11 = uVar13;
        } while (bVar2);
      }
      *pbVar19 = (byte)uVar13;
      if ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4)
          == (undefined1  [16])0x0) {
        piVar8 = (int *)((long)&this->field_0 + 0x38);
      }
      else {
        piVar8 = (int *)google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
      }
      target = target + 2;
      iVar4 = google::protobuf::internal::SooRep::size
                        (&pRVar1->soo_rep_,
                         (undefined1  [16])
                         ((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                         (undefined1  [16])0x0);
      piVar17 = piVar8 + iVar4;
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        uVar9 = (ulong)*piVar8;
        uVar6 = uVar9;
        if (0x7f < uVar9) {
          do {
            *target = (byte)uVar6 | 0x80;
            uVar9 = uVar6 >> 7;
            target = target + 1;
            bVar2 = 0x3fff < uVar6;
            uVar6 = uVar9;
          } while (bVar2);
        }
        piVar8 = piVar8 + 1;
        *target = (byte)uVar9;
        target = target + 1;
      } while (piVar8 < piVar17);
      goto LAB_001c808a;
    }
    _InternalSerialize();
LAB_001c84d0:
    target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
LAB_001c8119:
    target = google::protobuf::internal::WireFormatLite::InternalWriteGroup
                       (0x1ffffc78,&((this->field_0)._impl_.optionalgroup_)->super_MessageLite,
                        target,stream);
  }
  iVar4 = *(int *)((long)&this->field_0 + 0x48);
  if (iVar4 != 0) {
    if ((iVar4 == 1) || (stream->is_serialization_deterministic_ == false)) {
      uVar16 = *(uint *)((long)&this->field_0 + 0x50);
      uVar6 = (ulong)uVar16;
      if (uVar16 != *(uint *)((long)&this->field_0 + 0x4c)) {
        plVar18 = *(long **)(*(long *)((long)&this->field_0 + 0x58) + uVar6 * 8);
        if (plVar18 != (long *)0x0) goto LAB_001c8248;
        google::protobuf::internal::protobuf_assumption_failed
                  ("node != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
                   ,0x22e);
      }
LAB_001c8242:
      uVar6 = 0;
      plVar18 = (long *)0x0;
LAB_001c8248:
      while (plVar18 != (long *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
                 ::InternalSerialize(0x1ffffc7a,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(plVar18 + 1),
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(plVar18 + 5),target,stream);
        plVar18 = (long *)*plVar18;
        if (plVar18 == (long *)0x0) {
          do {
            uVar16 = (int)uVar6 + 1;
            uVar6 = (ulong)uVar16;
            if (*(uint *)((long)&this->field_0 + 0x4c) <= uVar16) goto LAB_001c8242;
            plVar18 = *(long **)(*(long *)((long)&this->field_0 + 0x58) + (ulong)uVar16 * 8);
          } while (plVar18 == (long *)0x0);
        }
      }
    }
    else {
      google::protobuf::internal::
      MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::MapSorterPtr(&local_40,
                     (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&(this->field_0)._impl_.string_string_map_);
      uVar3._M_t.super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
      super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
      super__Head_base<0UL,_const_void_**,_false>._M_head_impl =
           (__uniq_ptr_data<const_void_*,_std::default_delete<const_void_*[]>,_true,_true>)
           (__uniq_ptr_data<const_void_*,_std::default_delete<const_void_*[]>,_true,_true>)
           local_40.items_;
      if ((byte *)local_40.size_ != (byte *)0x0) {
        lVar14 = 0;
        do {
          target = google::protobuf::internal::
                   MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
                   ::InternalSerialize(0x1ffffc7a,
                                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         **)((long)uVar3._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                                  .super__Head_base<0UL,_const_void_**,_false>.
                                                  _M_head_impl + lVar14),
                                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         **)((long)uVar3._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                                  .super__Head_base<0UL,_const_void_**,_false>.
                                                  _M_head_impl + lVar14) + 1,target,stream);
          lVar14 = lVar14 + 8;
        } while (local_40.size_ << 3 != lVar14);
      }
      if ((_Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>)
          local_40.items_._M_t.
          super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
          super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
          super__Head_base<0UL,_const_void_**,_false>._M_head_impl != (void **)0x0) {
        operator_delete__((void *)local_40.items_._M_t.
                                  super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                  .super__Head_base<0UL,_const_void_**,_false>._M_head_impl);
      }
    }
  }
  uVar15 = (this->field_0)._impl_._oneof_case_[0];
  switch(uVar15) {
  case 0x1ffffc7b:
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar16 = *(uint *)((long)&this->field_0 + 0x98);
    uVar15 = (this->field_0)._impl_._oneof_case_[0];
    pbVar19 = target + 1;
    uVar13 = 0xffffe3d8;
    do {
      pbVar20 = pbVar19;
      pbVar20[-1] = (byte)uVar13 | 0x80;
      pbVar19 = pbVar20 + 1;
      bVar2 = 0x3fff < uVar13;
      uVar13 = uVar13 >> 7;
    } while (bVar2);
    uVar13 = 0;
    if (uVar15 == 0x1ffffc7b) {
      uVar13 = uVar16;
    }
    uVar6 = (ulong)uVar13;
    *pbVar20 = 0xf;
    if (0x7f < uVar13) {
      do {
        uVar16 = (uint)uVar6;
        *pbVar19 = (byte)uVar6 | 0x80;
        uVar6 = uVar6 >> 7;
        pbVar19 = pbVar19 + 1;
      } while (0x3fff < uVar16);
    }
    *pbVar19 = (byte)uVar6;
    target = pbVar19 + 1;
    break;
  case 0x1ffffc7c:
    value_00 = *(MessageLite **)((long)&this->field_0 + 0x98);
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (0x1ffffc7c,value_00,(int)value_00[1]._internal_metadata_.ptr_,target,stream)
    ;
    break;
  case 0x1ffffc7d:
    if (uVar15 == 0x1ffffc7d) {
      puVar7 = (undefined8 *)
               ((ulong)(this->field_0)._impl_.oneof_field_.oneof_test_all_types_ &
               0xfffffffffffffffc);
    }
    else {
      puVar7 = &google::protobuf::internal::fixed_address_empty_string;
    }
    pcVar10 = (char *)*puVar7;
    sVar12 = puVar7[1];
    uVar15 = 0x1ffffc7d;
    goto LAB_001c83ba;
  case 0x1ffffc7e:
    if (uVar15 == 0x1ffffc7e) {
      puVar7 = (undefined8 *)
               ((ulong)(this->field_0)._impl_.oneof_field_.oneof_test_all_types_ &
               0xfffffffffffffffc);
    }
    else {
      puVar7 = &google::protobuf::internal::fixed_address_empty_string;
    }
    pcVar10 = (char *)*puVar7;
    sVar12 = puVar7[1];
    uVar15 = 0x1ffffc7e;
LAB_001c83ba:
    s_01._M_str = pcVar10;
    s_01._M_len = sVar12;
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,uVar15,s_01,target);
  }
  uVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar6 & 1) != 0) {
    data = *(void **)((uVar6 & 0xfffffffffffffffe) + 8);
    uVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar6 & 1) == 0) {
      puVar7 = &google::protobuf::internal::fixed_address_empty_string;
      if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
        google::protobuf::internal::InitProtobufDefaultsSlow();
      }
    }
    else {
      puVar7 = (undefined8 *)((uVar6 & 0xfffffffffffffffe) + 8);
    }
    uVar16 = *(uint *)(puVar7 + 1);
    if ((long)stream->end_ - (long)target < (long)(int)uVar16) {
      target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,data,uVar16,target);
    }
    else {
      memcpy(target,data,(ulong)uVar16);
      target = target + (int)uVar16;
    }
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestHugeFieldNumbersLite::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestHugeFieldNumbersLite& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestHugeFieldNumbersLite)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // All extensions.
  target = this_._impl_._extensions_._InternalSerializeAll(&default_instance(),
                                                    target, stream);
  cached_has_bits = this_._impl_._has_bits_[0];
  // int32 optional_int32 = 536870000;
  if ((cached_has_bits & 0x00000010u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        536870000, this_._internal_optional_int32(), target);
  }

  // int32 fixed_32 = 536870001;
  if ((cached_has_bits & 0x00000020u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        536870001, this_._internal_fixed_32(), target);
  }

  // repeated int32 repeated_int32 = 536870002;
  for (int i = 0, n = this_._internal_repeated_int32_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        536870002, this_._internal_repeated_int32().Get(i), target);
  }

  // repeated int32 packed_int32 = 536870003 [features = {
  {
    int byte_size = this_._impl_._packed_int32_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          536870003, this_._internal_packed_int32(), byte_size, target);
    }
  }

  // .proto2_unittest.ForeignEnumLite optional_enum = 536870004;
  if ((cached_has_bits & 0x00000040u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        536870004, this_._internal_optional_enum(), target);
  }

  // string optional_string = 536870005;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_optional_string();
    target = stream->WriteStringMaybeAliased(536870005, _s, target);
  }

  // bytes optional_bytes = 536870006;
  if ((cached_has_bits & 0x00000002u) != 0) {
    const ::std::string& _s = this_._internal_optional_bytes();
    target = stream->WriteBytesMaybeAliased(536870006, _s, target);
  }

  // .proto2_unittest.ForeignMessageLite optional_message = 536870007;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        536870007, *this_._impl_.optional_message_, this_._impl_.optional_message_->GetCachedSize(), target,
        stream);
  }

  // .proto2_unittest.TestHugeFieldNumbersLite.OptionalGroup optionalgroup = 536870008 [features = {
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteGroup(
        536870008, *this_._impl_.optionalgroup_, target, stream);
  }

  // map<string, string> string_string_map = 536870010;
  if (!this_._internal_string_string_map().empty()) {
    using MapType = ::google::protobuf::Map<std::string, std::string>;
    using WireHelper = _pbi::MapEntryFuncs<std::string, std::string,
                                   _pbi::WireFormatLite::TYPE_STRING,
                                   _pbi::WireFormatLite::TYPE_STRING>;
    const auto& field = this_._internal_string_string_map();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterPtr<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            536870010, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            536870010, entry.first, entry.second, target, stream);
      }
    }
  }

  switch (this_.oneof_field_case()) {
    case kOneofUint32: {
      target = stream->EnsureSpace(target);
      target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
          536870011, this_._internal_oneof_uint32(), target);
      break;
    }
    case kOneofTestAllTypes: {
      target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
          536870012, *this_._impl_.oneof_field_.oneof_test_all_types_, this_._impl_.oneof_field_.oneof_test_all_types_->GetCachedSize(), target,
          stream);
      break;
    }
    case kOneofString: {
      const ::std::string& _s = this_._internal_oneof_string();
      target = stream->WriteStringMaybeAliased(536870013, _s, target);
      break;
    }
    case kOneofBytes: {
      const ::std::string& _s = this_._internal_oneof_bytes();
      target = stream->WriteBytesMaybeAliased(536870014, _s, target);
      break;
    }
    default:
      break;
  }
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(
        this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).data(),
        static_cast<int>(this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestHugeFieldNumbersLite)
  return target;
}